

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

bfile_t * bf_create_m(uint8_t *buffer,uint len)

{
  bfile_t *pbVar1;
  
  pbVar1 = (bfile_t *)malloc(0x50);
  pbVar1->progress_cb = (_func_int_float_void_ptr *)0x0;
  pbVar1->progress_data = (void *)0x0;
  pbVar1->file = (FILE *)0x0;
  pbVar1->size = 0;
  pbVar1->pos = 0;
  pbVar1->ipos = 0;
  pbVar1->filename = (char *)0x0;
  pbVar1->buffer = buffer;
  pbVar1->size = (ulong)len;
  pbVar1->buffer_size = len;
  pbVar1->flags = 0x500;
  pbVar1->ipos = (ulong)len;
  return pbVar1;
}

Assistant:

bfile_t  *
bf_create_m(
    const uint8_t * buffer,
    unsigned int len )
{
    bfile_t * bfile;
    bfile = create_bfile_t( 0 );
    bfile->buffer = (uint8_t*) buffer;
    bfile->size = len;
    bfile->buffer_size = len;
    bfile->flags |= BF_MEMBUFFER | BF_READABLE;
    bfile->ipos = len;
    return bfile;
}